

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter-base.hxx
# Opt level: O1

StateVector * __thiscall
stateObservation::compileTime::KalmanFilterBase<4U,_3U,_0U>::oneStepEstimation_
          (StateVector *__return_storage_ptr__,KalmanFilterBase<4U,_3U,_0U> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _Map_pointer ppIVar5;
  _Map_pointer ppIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  StateVector *pSVar9;
  IndexedMatrix<3U,_1U> *pIVar10;
  long lVar11;
  _Elt_pointer pIVar12;
  char *__function;
  ulong uVar13;
  ulong uVar14;
  Index outer;
  uint uVar15;
  MatrixT *pMVar16;
  MatrixT *pMVar17;
  MatrixT *pMVar18;
  double *pdVar19;
  RhsNested pMVar20;
  ActualDstType actualDst;
  byte bVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  Cmatrix c;
  Pmatrix pbar;
  Kmatrix kGain;
  StateVector xbar;
  DstEvaluatorType dstEvaluator;
  Amatrix a;
  Pmatrix px;
  Rmatrix inoCov;
  assign_op<double,_double> local_439;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  Matrix<double,_3,_4,_0,_3,_4> local_418;
  StateVector *local_3b0;
  SrcEvaluatorType local_3a8;
  undefined1 local_308 [40];
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  undefined1 local_2c8 [16];
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_0>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>
  local_260;
  double local_238 [4];
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8 [16];
  undefined1 local_138 [40];
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  Matrix<double,_3,_3,_0,_3,_3> local_d8;
  RhsNested pMStack_90;
  Matrix<double,_3,_3,_0,_3,_3> *local_88;
  undefined8 local_80;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_78 [2];
  
  bVar21 = 0;
  if ((this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.isSet_ == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]";
    goto LAB_001163d7;
  }
  ppIVar5 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
            super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppIVar6 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
            super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pIVar10 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
            super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pIVar10 >> 5) +
      ((long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)ppIVar5 - (long)ppIVar6) >> 3) - 1) + (ulong)(ppIVar5 == (_Map_pointer)0x0))
      * 0x10 == 0) {
LAB_001162bd:
    __assert_fail("this->y_.size()> 0 && this->y_[0].getTime()==k+1 && \"ERROR: The measurement vector is not set\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                  ,0x41,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                 );
  }
  uVar13 = (long)pIVar10 -
           (long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
                 super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 5;
  if (0xf < uVar13) {
    uVar14 = uVar13 >> 4 | 0xf000000000000000;
    if (0 < (long)uVar13) {
      uVar14 = uVar13 >> 4;
    }
    pIVar10 = ppIVar6[uVar14] + uVar13 + uVar14 * -0x10;
  }
  if (pIVar10->isSet_ != false) {
    uVar15 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.k_ + 1;
    if (pIVar10->k_ != uVar15) goto LAB_001162bd;
    if ((this->a_).isSet_ == false) {
      __assert_fail("a_.isSet() && \"ERROR: The Matrix A is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x45,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->c_).isSet_ == false) {
      __assert_fail("c_.isSet() && \"ERROR: The Matrix C is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x46,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->q_).isSet_ == false) {
      __assert_fail("q_.isSet() && \"ERROR: The Matrix Q is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x47,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->r_).isSet_ == false) {
      __assert_fail("r_.isSet() && \"ERROR: The Matrix R is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x48,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->p_).isSet_ == false) {
      __assert_fail("p_.isSet() && \"ERROR: The Matrix P is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x49,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    pMVar17 = &(this->a_).v_;
    pdVar19 = local_238;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pdVar19 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
      pMVar17 = (MatrixT *)
                ((pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array + 1);
      pdVar19 = pdVar19 + 1;
    }
    pMVar16 = &(this->c_).v_;
    pdVar19 = (double *)&local_418;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pdVar19 = (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
                 m_data.array[0];
      pMVar16 = (MatrixT *)
                ((pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
                 m_data.array + 1);
      pdVar19 = pdVar19 + 1;
    }
    pMVar17 = &(this->p_).v_;
    pdVar19 = local_1b8;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pdVar19 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
      pMVar17 = (MatrixT *)
                ((pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array + 1);
      pdVar19 = pdVar19 + 1;
    }
    (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>._vptr_ObserverBase
      [0x17])(&local_288,this,(ulong)uVar15);
    if ((this->q_).isSet_ == false) {
      __function = 
      "void stateObservation::compileTime::IndexedMatrix<4, 4>::check_() const [r = 4, c = 4]";
      goto LAB_001163d7;
    }
    pMVar17 = &(this->q_).v_;
    pdVar19 = (double *)local_308;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pdVar19 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
      pMVar17 = (MatrixT *)((long)pMVar17 + (ulong)bVar21 * -0x10 + 8);
      pdVar19 = pdVar19 + (ulong)bVar21 * -2 + 1;
    }
    local_260.m_lhs._0_8_ = local_138 + 0x20;
    local_138._16_8_ = local_260.m_lhs._0_8_;
    lVar11 = 0;
    do {
      dVar1 = *(double *)((long)local_1b8 + lVar11);
      dVar2 = *(double *)((long)local_1b8 + lVar11 + 8);
      dVar3 = *(double *)((long)local_1b8 + lVar11 + 0x10);
      dVar4 = *(double *)((long)local_1b8 + lVar11 + 0x18);
      *(double *)
       ((long)local_3a8.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar11) =
           local_1d8 * dVar4 + local_1f8 * dVar3 + local_218 * dVar2 + local_238[0] * dVar1;
      *(double *)
       ((long)local_3a8.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar11 + 8) =
           dStack_1d0 * dVar4 + dStack_1f0 * dVar3 + dStack_210 * dVar2 + local_238[1] * dVar1;
      *(double *)
       ((long)local_3a8.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar11 + 0x10) =
           dVar4 * local_1c8 + dVar3 * local_1e8 + dVar2 * local_208 + dVar1 * local_238[2];
      *(double *)
       ((long)local_3a8.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar11 + 0x18) =
           dVar4 * dStack_1c0 + dVar3 * dStack_1e0 + dVar2 * dStack_200 + dVar1 * local_238[3];
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x80);
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)&local_3a8;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 4;
    local_78[0].m_dst = (DstEvaluatorType *)&local_260;
    local_78[0].m_functor = &local_439;
    lVar11 = 0;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs.m_matrix = (non_const_type)local_238;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::IndexBased,_double>
            )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::IndexBased,_double>
              )local_238;
    local_78[0].m_src =
         (SrcEvaluatorType *)
         local_3a8.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.
         m_d.data;
    local_78[0].m_dstExpr = (DstXprType *)local_260.m_lhs._0_8_;
    do {
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
      ::run(local_78,lVar11);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[0] + (double)local_308._0_8_;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[4] + (double)local_308._8_8_;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[8] + (double)local_308._16_8_;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[0xc] + (double)local_308._24_8_;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[1] + (double)local_308._32_8_;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[5] + dStack_2e0;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[9] + local_2d8;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[0xd] + dStack_2d0;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[2] + (double)local_2c8._0_8_;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[6] + (double)local_2c8._8_8_;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
         (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            *)local_138._16_8_)->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
         .m_storage.m_data.array[10] + local_2b8;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
         = (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              *)local_138._16_8_)->m_lhs).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
           + dStack_2b0;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
         = (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              *)local_138._16_8_)->m_lhs).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] +
           local_2a8;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
         = (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              *)local_138._16_8_)->m_lhs).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] +
           local_2a0;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
         = (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              *)local_138._16_8_)->m_lhs).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
           + local_298;
    local_3a8.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
         = (((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              *)local_138._16_8_)->m_lhs).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
           + local_290;
    pIVar12 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
              super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar13 = (long)pIVar12 -
             (long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
                   super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 5;
    if (0xf < uVar13) {
      uVar14 = uVar13 >> 4 | 0xf000000000000000;
      if (0 < (long)uVar13) {
        uVar14 = uVar13 >> 4;
      }
      pIVar12 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
                super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar13 + uVar14 * -0x10;
    }
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = (double)local_308;
    if (pIVar12->isSet_ != false) {
      local_438 = *(undefined1 (*) [16])
                   (pIVar12->v_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array;
      local_428._8_8_ = 0;
      local_428._0_8_ =
           (pIVar12->v_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[2];
      local_3b0 = __return_storage_ptr__;
      (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>.
        _vptr_ObserverBase[0x18])((RhsNested)local_138,this,&local_288,(ulong)uVar15);
      if ((this->r_).isSet_ != false) {
        uVar22 = local_428._12_4_;
        local_428._8_4_ = local_428._8_4_;
        local_428._0_8_ = local_428._0_8_ - (double)local_138._16_8_;
        local_428._12_4_ = uVar22;
        local_138._8_8_ = (double)local_438._8_8_ - (double)local_138._8_8_;
        local_438._8_4_ = (int)local_138._8_8_;
        local_438._0_8_ = (double)local_438._0_8_ - (double)local_138._0_8_;
        local_438._12_4_ = (int)((ulong)local_138._8_8_ >> 0x20);
        pMVar18 = &(this->r_).v_;
        pMVar20 = (RhsNested)local_138;
        for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0] = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[0];
          pMVar18 = (MatrixT *)((long)pMVar18 + (ulong)bVar21 * -0x10 + 8);
          pMVar20 = (RhsNested)((long)pMVar20 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        local_308._0_8_ = &local_418;
        local_308._8_8_ = &local_3a8;
        local_308._16_8_ = local_308._0_8_;
        local_308._24_8_ = (RhsNested)local_138;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,_3,_3,_0,_3,_3> *)local_78,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                    *)local_308,(assign_op<double,_double> *)&local_260);
        local_138._0_8_ =
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xc] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[9] +
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[8] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[6] +
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[4] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[3] +
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[0];
        local_138._8_8_ =
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xd] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[9] +
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[9] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[6] +
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[5] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[3] +
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1] *
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[0];
        local_138._16_8_ =
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[9] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xe] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[6] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[10] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[3] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[6] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[0] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2];
        local_138._24_8_ =
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[9] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xf] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[6] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xb] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[3] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[7] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[0] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[3];
        local_260.m_lhs._0_8_ = &local_3a8;
        local_260.m_lhs.m_rhs.m_lhs = (LhsNested)&local_418;
        local_138._32_8_ =
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[10] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xc] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[7] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[8] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[4] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[4] +
             local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[1] *
             local_3a8.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0];
        dStack_110 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[10] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xd] +
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[7] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[9] +
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[4] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[5] +
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[1] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1];
        local_108 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[10] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xe] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[7] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[10] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[4] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[6] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[1] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[2];
        dStack_100 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[10] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xf] +
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[7] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xb] +
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[4] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[7] +
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[1] *
                     local_3a8.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3];
        local_f8 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[0xb] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xc] +
                   local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[8] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[8] +
                   local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[5] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4] +
                   local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
        dStack_f0 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[0xb] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xd] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[8] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[9] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[5] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[5] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[2] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[1];
        local_e8 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[0xb] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xe] +
                   local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[8] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10] +
                   local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[5] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[6] +
                   local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] *
                   local_3a8.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
        dStack_e0 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[0xb] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xf] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[8] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xb] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[5] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[7] +
                    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data.array[2] *
                    local_3a8.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[3];
        local_260.m_lhs.m_rhs.m_rhs = (RhsNested)local_78;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_d8,(SrcXprType *)&local_260.m_lhs.m_rhs.m_rhs,
              (assign_op<double,_double> *)local_308);
        pSVar9 = local_3b0;
        local_80 = 3;
        local_308._0_8_ =
             local_f8 *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[2] +
             (double)local_138._32_8_ *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[1] +
             (double)local_138._0_8_ *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0];
        local_308._8_8_ =
             dStack_f0 *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[2] +
             dStack_110 *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[1] +
             (double)local_138._8_8_ *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0];
        local_308._16_8_ =
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[2] * local_e8 +
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[1] * local_108 +
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0] * (double)local_138._16_8_;
        local_308._24_8_ =
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[2] * dStack_e0 +
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[1] * dStack_100 +
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0] * (double)local_138._24_8_;
        local_308._32_8_ =
             local_f8 *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[5] +
             (double)local_138._32_8_ *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[4] +
             (double)local_138._0_8_ *
             local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[3];
        dStack_2e0 = dStack_f0 *
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[5] +
                     dStack_110 *
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[4] +
                     (double)local_138._8_8_ *
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[3];
        local_2d8 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[5] * local_e8 +
                    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[4] * local_108 +
                    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[3] * (double)local_138._16_8_;
        dStack_2d0 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[5] * dStack_e0 +
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[4] * dStack_100 +
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[3] * (double)local_138._24_8_;
        dVar1 = local_f8 *
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[8] +
                (double)local_138._32_8_ *
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] +
                (double)local_138._0_8_ *
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6];
        dVar2 = dStack_f0 *
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[8] +
                dStack_110 *
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] +
                (double)local_138._8_8_ *
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6];
        local_2c8._8_4_ = SUB84(dVar2,0);
        local_2c8._0_8_ = dVar1;
        local_2c8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_2b8 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[8] * local_e8 +
                    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[7] * local_108 +
                    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[6] * (double)local_138._16_8_;
        dStack_2b0 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[8] * dStack_e0 +
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[7] * dStack_100 +
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[6] * (double)local_138._24_8_;
        (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[0] = local_288;
        (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[1] = dStack_280;
        local_288 = dVar1 * (double)local_428._0_8_ +
                    (double)local_308._32_8_ * (double)local_438._8_8_ +
                    (double)local_308._0_8_ * (double)local_438._0_8_ + local_288;
        dStack_280 = dVar2 * (double)local_428._0_8_ +
                     dStack_2e0 * (double)local_438._8_8_ +
                     (double)local_308._8_8_ * (double)local_438._0_8_ + dStack_280;
        uVar22 = SUB84(dStack_280,0);
        uVar23 = (undefined4)((ulong)dStack_280 >> 0x20);
        local_278 = (double)local_428._0_8_ * local_2b8 +
                    (double)local_438._8_8_ * local_2d8 +
                    (double)local_438._0_8_ * (double)local_308._16_8_ + local_278;
        dStack_270 = (double)local_428._0_8_ * dStack_2b0 +
                     (double)local_438._8_8_ * dStack_2d0 +
                     (double)local_438._0_8_ * (double)local_308._24_8_ + dStack_270;
        auVar7._8_4_ = uVar22;
        auVar7._0_8_ = local_288;
        auVar7._12_4_ = uVar23;
        *(undefined1 (*) [16])
         (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
         array = auVar7;
        (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[2] = local_278;
        (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[3] = dStack_270;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.k_ = uVar15;
        auVar8._8_4_ = uVar22;
        auVar8._0_8_ = local_288;
        auVar8._12_4_ = uVar23;
        *(undefined1 (*) [16])
         (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.v_.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array =
             auVar8;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.v_.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
             local_278;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.v_.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
             dStack_270;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.isSet_ = true;
        local_260.m_lhs.m_rhs.m_rhs = &local_418;
        local_260.m_rhs = (RhsNested)&local_3a8;
        local_260.m_lhs.m_rhs.m_lhs = (LhsNested)local_308;
        pMStack_90 = (RhsNested)local_138;
        local_88 = &local_d8;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,4,0,3,4>,0>const>,Eigen::Matrix<double,4,4,0,4,4>,1>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,_4,_4,_0,_4,_4> *)local_138,&local_260,&local_439);
        (this->p_).k_ = uVar15;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_138._0_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)local_138._8_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = (double)local_138._16_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = (double)local_138._24_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)local_138._32_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = dStack_110;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = local_108;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = dStack_100;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = local_f8;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = dStack_f0;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = local_e8;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = dStack_e0;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[0];
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[1];
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[2];
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[3];
        (this->p_).isSet_ = true;
        return pSVar9;
      }
      __function = 
      "void stateObservation::compileTime::IndexedMatrix<3, 3>::check_() const [r = 3, c = 3]";
      goto LAB_001163d7;
    }
  }
  __function = 
  "void stateObservation::compileTime::IndexedMatrix<3, 1>::check_() const [r = 3, c = 1]";
LAB_001163d7:
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,__function);
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilterBase<n,m,p>::oneStepEstimation_()
{
    unsigned k=this->x_.getTime();
    BOOST_ASSERT(this->y_.size()> 0 && this->y_[0].getTime()==k+1 && "ERROR: The measurement vector is not set");
    if (p>0)
        BOOST_ASSERT(this->u_.size()> 0 && this->u_[0].getTime()==k && "ERROR: The input vector is not set");

    BOOST_ASSERT(a_.isSet() && "ERROR: The Matrix A is not initialized" );
    BOOST_ASSERT(c_.isSet() && "ERROR: The Matrix C is not initialized");
    BOOST_ASSERT(q_.isSet() && "ERROR: The Matrix Q is not initialized");
    BOOST_ASSERT(r_.isSet() && "ERROR: The Matrix R is not initialized");
    BOOST_ASSERT(p_.isSet() && "ERROR: The Matrix P is not initialized");

    Amatrix a=a_();
    Cmatrix c=c_();
    Pmatrix px=p_();

    //prediction
    typename ObserverBase<n,m,p>::StateVector xbar=prediction_(k+1);
    Pmatrix pbar=a*px*a.transpose()+q_();

    //innovation
    typename ObserverBase<n,m,p>::MeasureVector ino= this->y_[0]() - simulateSensor_(xbar,k+1);
    Rmatrix inoCov = c * pbar * c.transpose() + r_();

    //gain
    Kmatrix kGain ((pbar * c.transpose()) * inoCov.inverse());

    //update
    typename ObserverBase<n,m,p>::StateVector xhat=xbar+kGain*ino;

    this->x_.set(xhat,k+1);
    p_.set((Pmatrix::Identity()-kGain*c)*pbar,k+1);

    return xhat;
}